

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O3

OPJ_BOOL opj_t2_encode_packets
                   (opj_t2_t *p_t2,OPJ_UINT32 p_tile_no,opj_tcd_tile_t *p_tile,
                   OPJ_UINT32 p_maxlayers,OPJ_BYTE *p_dest,OPJ_UINT32 *p_data_written,
                   OPJ_UINT32 p_max_len,opj_codestream_info_t *cstr_info,OPJ_UINT32 p_tp_num,
                   OPJ_INT32 p_tp_pos,OPJ_UINT32 p_pino,J2K_T2_MODE p_t2_mode,
                   opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  uint uVar2;
  int iVar3;
  OPJ_BOOL OVar4;
  OPJ_BOOL OVar5;
  undefined8 uVar6;
  OPJ_UINT32 *pOVar7;
  OPJ_UINT32 OVar8;
  opj_packet_info_t *poVar9;
  OPJ_UINT32 l_comp_len;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  opj_pi_iterator_t *poVar13;
  OPJ_UINT32 local_74;
  uint local_70;
  OPJ_UINT16 local_6a;
  opj_pi_iterator_t *local_68;
  opj_cp_t *local_60;
  opj_tcp_t *local_58;
  ulong local_50;
  OPJ_UINT32 *local_48;
  opj_tcd_tile_t *local_40;
  OPJ_UINT32 local_38;
  OPJ_UINT32 local_34;
  
  local_60 = p_t2->cp;
  uVar12 = (ulong)p_tile_no;
  local_58 = local_60->tcps + uVar12;
  if ((local_60->m_specific_param).m_dec.m_reduce == 0) {
    OVar8 = 1;
  }
  else {
    OVar8 = p_t2->image->numcomps;
  }
  local_6a = local_60->rsiz;
  OVar1 = local_58->numpocs;
  local_48 = p_data_written;
  local_40 = p_tile;
  local_68 = opj_pi_initialise_encode(p_t2->image,local_60,p_tile_no,p_t2_mode);
  if (local_68 == (opj_pi_iterator_t *)0x0) {
    return 0;
  }
  local_34 = OVar1 + 1;
  *local_48 = 0;
  local_50 = uVar12;
  if (p_t2_mode == THRESH_CALC) {
    if (OVar8 != 0) {
      local_70 = 0;
      pOVar7 = local_48;
      local_38 = OVar8;
      do {
        uVar6 = CONCAT71((int7)((ulong)pOVar7 >> 8),1);
        uVar10 = 0;
        OVar8 = 0;
        poVar13 = local_68;
        do {
          local_50 = CONCAT44(local_50._4_4_,(int)uVar6);
          opj_pi_create_encode(local_68,local_60,p_tile_no,OVar8,local_70,p_tp_pos,THRESH_CALC);
          OVar4 = 0;
          if ((poVar13->poc).prg == OPJ_PROG_UNKNOWN) goto LAB_00134c3f;
          while (OVar4 = opj_pi_next(poVar13), OVar4 != 0) {
            if (poVar13->layno < p_maxlayers) {
              OVar4 = 0;
              local_74 = 0;
              OVar5 = opj_t2_encode_packet
                                (p_tile_no,local_40,local_58,poVar13,p_dest,&local_74,p_max_len,
                                 cstr_info,THRESH_CALC,p_manager);
              if (OVar5 == 0) goto LAB_00134c3f;
              uVar10 = uVar10 + local_74;
              p_dest = p_dest + local_74;
              p_max_len = p_max_len - local_74;
              *local_48 = *local_48 + local_74;
            }
          }
          uVar2 = (local_60->m_specific_param).m_dec.m_reduce;
          if ((uVar2 != 0) && (OVar4 = 0, uVar2 < uVar10)) goto LAB_00134c3f;
          poVar13 = poVar13 + 1;
          OVar8 = 1;
          uVar6 = 0;
        } while (((byte)local_50 & local_6a == 4) != 0);
        local_70 = local_70 + 1;
        pOVar7 = (OPJ_UINT32 *)(ulong)local_70;
        OVar4 = 1;
      } while (local_70 != local_38);
      goto LAB_00134c3f;
    }
  }
  else {
    opj_pi_create_encode(local_68,local_60,p_tile_no,p_pino,p_tp_num,p_tp_pos,p_t2_mode);
    OVar4 = 0;
    if (local_68[p_pino].poc.prg == OPJ_PROG_UNKNOWN) goto LAB_00134c3f;
    poVar13 = local_68 + p_pino;
    iVar3 = opj_pi_next(poVar13);
    uVar12 = local_50;
    while (iVar3 != 0) {
      if (poVar13->layno < p_maxlayers) {
        local_74 = 0;
        OVar4 = opj_t2_encode_packet
                          (p_tile_no,local_40,local_58,poVar13,p_dest,&local_74,p_max_len,cstr_info,
                           p_t2_mode,p_manager);
        if (OVar4 == 0) {
          OVar4 = 0;
          goto LAB_00134c3f;
        }
        *local_48 = *local_48 + local_74;
        if (cstr_info != (opj_codestream_info_t *)0x0) {
          iVar3 = cstr_info->packno;
          if (cstr_info->index_write != 0) {
            poVar9 = cstr_info->tile[uVar12].packet + iVar3;
            if (iVar3 == 0) {
              lVar11 = (long)cstr_info->tile[uVar12].end_header;
LAB_00134aca:
              lVar11 = lVar11 + 1;
            }
            else if (((((byte)local_58->field_0x1638 >> 2 |
                       *(byte *)((long)&local_60->m_specific_param + 0x11) >> 3) & 1) == 0) ||
                    (lVar11 = poVar9->start_pos, lVar11 == 0)) {
              lVar11 = poVar9[-1].end_pos;
              goto LAB_00134aca;
            }
            poVar9->start_pos = lVar11;
            poVar9->end_pos = (ulong)local_74 + lVar11 + -1;
            poVar9->end_ph_pos = lVar11 + poVar9->end_ph_pos + -1;
          }
          cstr_info->packno = iVar3 + 1;
        }
        p_dest = p_dest + local_74;
        p_max_len = p_max_len - local_74;
        local_40->packno = local_40->packno + 1;
      }
      iVar3 = opj_pi_next(poVar13);
    }
  }
  OVar4 = 1;
LAB_00134c3f:
  opj_pi_destroy(local_68,local_34);
  return OVar4;
}

Assistant:

OPJ_BOOL opj_t2_encode_packets(opj_t2_t* p_t2,
                               OPJ_UINT32 p_tile_no,
                               opj_tcd_tile_t *p_tile,
                               OPJ_UINT32 p_maxlayers,
                               OPJ_BYTE *p_dest,
                               OPJ_UINT32 * p_data_written,
                               OPJ_UINT32 p_max_len,
                               opj_codestream_info_t *cstr_info,
                               OPJ_UINT32 p_tp_num,
                               OPJ_INT32 p_tp_pos,
                               OPJ_UINT32 p_pino,
                               J2K_T2_MODE p_t2_mode,
                               opj_event_mgr_t *p_manager)
{
    OPJ_BYTE *l_current_data = p_dest;
    OPJ_UINT32 l_nb_bytes = 0;
    OPJ_UINT32 compno;
    OPJ_UINT32 poc;
    opj_pi_iterator_t *l_pi = 00;
    opj_pi_iterator_t *l_current_pi = 00;
    opj_image_t *l_image = p_t2->image;
    opj_cp_t *l_cp = p_t2->cp;
    opj_tcp_t *l_tcp = &l_cp->tcps[p_tile_no];
    OPJ_UINT32 pocno = (l_cp->rsiz == OPJ_PROFILE_CINEMA_4K) ? 2 : 1;
    OPJ_UINT32 l_max_comp = l_cp->m_specific_param.m_enc.m_max_comp_size > 0 ?
                            l_image->numcomps : 1;
    OPJ_UINT32 l_nb_pocs = l_tcp->numpocs + 1;

    l_pi = opj_pi_initialise_encode(l_image, l_cp, p_tile_no, p_t2_mode);
    if (!l_pi) {
        return OPJ_FALSE;
    }

    * p_data_written = 0;

    if (p_t2_mode == THRESH_CALC) { /* Calculating threshold */
        l_current_pi = l_pi;

        for (compno = 0; compno < l_max_comp; ++compno) {
            OPJ_UINT32 l_comp_len = 0;
            l_current_pi = l_pi;

            for (poc = 0; poc < pocno ; ++poc) {
                OPJ_UINT32 l_tp_num = compno;

                /* TODO MSD : check why this function cannot fail (cf. v1) */
                opj_pi_create_encode(l_pi, l_cp, p_tile_no, poc, l_tp_num, p_tp_pos, p_t2_mode);

                if (l_current_pi->poc.prg == OPJ_PROG_UNKNOWN) {
                    /* TODO ADE : add an error */
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    return OPJ_FALSE;
                }
                while (opj_pi_next(l_current_pi)) {
                    if (l_current_pi->layno < p_maxlayers) {
                        l_nb_bytes = 0;

                        if (! opj_t2_encode_packet(p_tile_no, p_tile, l_tcp, l_current_pi,
                                                   l_current_data, &l_nb_bytes,
                                                   p_max_len, cstr_info,
                                                   p_t2_mode,
                                                   p_manager)) {
                            opj_pi_destroy(l_pi, l_nb_pocs);
                            return OPJ_FALSE;
                        }

                        l_comp_len += l_nb_bytes;
                        l_current_data += l_nb_bytes;
                        p_max_len -= l_nb_bytes;

                        * p_data_written += l_nb_bytes;
                    }
                }

                if (l_cp->m_specific_param.m_enc.m_max_comp_size) {
                    if (l_comp_len > l_cp->m_specific_param.m_enc.m_max_comp_size) {
                        opj_pi_destroy(l_pi, l_nb_pocs);
                        return OPJ_FALSE;
                    }
                }

                ++l_current_pi;
            }
        }
    } else { /* t2_mode == FINAL_PASS  */
        opj_pi_create_encode(l_pi, l_cp, p_tile_no, p_pino, p_tp_num, p_tp_pos,
                             p_t2_mode);

        l_current_pi = &l_pi[p_pino];
        if (l_current_pi->poc.prg == OPJ_PROG_UNKNOWN) {
            /* TODO ADE : add an error */
            opj_pi_destroy(l_pi, l_nb_pocs);
            return OPJ_FALSE;
        }
        while (opj_pi_next(l_current_pi)) {
            if (l_current_pi->layno < p_maxlayers) {
                l_nb_bytes = 0;

                if (! opj_t2_encode_packet(p_tile_no, p_tile, l_tcp, l_current_pi,
                                           l_current_data, &l_nb_bytes, p_max_len,
                                           cstr_info, p_t2_mode, p_manager)) {
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    return OPJ_FALSE;
                }

                l_current_data += l_nb_bytes;
                p_max_len -= l_nb_bytes;

                * p_data_written += l_nb_bytes;

                /* INDEX >> */
                if (cstr_info) {
                    if (cstr_info->index_write) {
                        opj_tile_info_t *info_TL = &cstr_info->tile[p_tile_no];
                        opj_packet_info_t *info_PK = &info_TL->packet[cstr_info->packno];
                        if (!cstr_info->packno) {
                            info_PK->start_pos = info_TL->end_header + 1;
                        } else {
                            info_PK->start_pos = ((l_cp->m_specific_param.m_enc.m_tp_on | l_tcp->POC) &&
                                                  info_PK->start_pos) ? info_PK->start_pos : info_TL->packet[cstr_info->packno -
                                                                            1].end_pos + 1;
                        }
                        info_PK->end_pos = info_PK->start_pos + l_nb_bytes - 1;
                        info_PK->end_ph_pos += info_PK->start_pos -
                                               1;  /* End of packet header which now only represents the distance
                                                                                                                                                                                                                                                   to start of packet is incremented by value of start of packet*/
                    }

                    cstr_info->packno++;
                }
                /* << INDEX */
                ++p_tile->packno;
            }
        }
    }

    opj_pi_destroy(l_pi, l_nb_pocs);

    return OPJ_TRUE;
}